

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,FILE *fp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  size_t sStack_60;
  int id;
  int len;
  char vstr [16];
  
  clear(this);
  id = 0;
  do {
    iVar2 = __isoc99_fscanf(fp,"%d=",&id);
    if (iVar2 != 1) {
      return 0;
    }
    if (id < -0x5b03) {
      id = -0x5b04 - id;
      len = 0;
      iVar2 = __isoc99_fscanf(fp,"%d",&len);
      if (iVar2 != 1) {
        pcVar4 = "ParamDict read array length fail\n";
        sStack_60 = 0x21;
        goto LAB_0011970f;
      }
      Mat::create(&this->params[id].v,len,4,(Allocator *)0x0);
      lVar5 = 0;
      for (lVar3 = 0; lVar3 < len; lVar3 = lVar3 + 1) {
        iVar2 = __isoc99_fscanf(fp,",%15[^,\n ]",vstr);
        if (iVar2 != 1) {
          pcVar4 = "ParamDict read array element fail\n";
          sStack_60 = 0x22;
          goto LAB_0011970f;
        }
        bVar1 = vstr_is_float(vstr);
        if (bVar1) {
          pcVar4 = "%f";
        }
        else {
          pcVar4 = "%d";
        }
        iVar2 = __isoc99_sscanf(vstr,pcVar4,(long)this->params[id].v.data + lVar5);
        if (iVar2 != 1) {
          pcVar4 = "ParamDict parse array element fail\n";
          sStack_60 = 0x23;
          goto LAB_0011970f;
        }
        lVar5 = lVar5 + 4;
      }
    }
    else {
      iVar2 = __isoc99_fscanf(fp,"%15s",vstr);
      if (iVar2 != 1) {
        pcVar4 = "ParamDict read value fail\n";
        sStack_60 = 0x1a;
LAB_0011970f:
        fwrite(pcVar4,sStack_60,1,_stderr);
        return -1;
      }
      bVar1 = vstr_is_float(vstr);
      pcVar4 = "%d";
      if (bVar1) {
        pcVar4 = "%f";
      }
      iVar2 = __isoc99_sscanf(vstr,pcVar4,&this->params[id].field_1);
      if (iVar2 != 1) {
        pcVar4 = "ParamDict parse value fail\n";
        sStack_60 = 0x1b;
        goto LAB_0011970f;
      }
    }
    this->params[id].loaded = 1;
  } while( true );
}

Assistant:

int ParamDict::load_param(FILE* fp)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (fscanf(fp, "%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = fscanf(fp, "%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length fail\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = fscanf(fp, ",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element fail\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element fail\n");
                    return -1;
                }
            }
        }
        else
        {
            char vstr[16];
            int nscan = fscanf(fp, "%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value fail\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value fail\n");
                return -1;
            }
        }

        params[id].loaded = 1;
    }

    return 0;
}